

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O2

void __thiscall getarg_tests::patharg::test_method(patharg *this)

{
  long lVar1;
  string arg;
  string arg_00;
  string arg_01;
  string arg_02;
  string arg_03;
  string arg_04;
  string arg_05;
  string arg_06;
  string arg_07;
  string arg_08;
  string arg_09;
  string arg_10;
  string arg_11;
  string arg_12;
  string arg_13;
  string arg_14;
  string arg_15;
  string arg_16;
  string arg_17;
  string arg_18;
  string arg_19;
  string arg_20;
  string arg_21;
  string arg_22;
  string arg_23;
  string arg_24;
  iterator in_R8;
  iterator pvVar2;
  iterator pvVar3;
  iterator in_R9;
  path *ppVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  undefined8 in_stack_fffffffffffff418;
  char *pcVar5;
  undefined8 in_stack_fffffffffffff420;
  char *pcVar6;
  undefined8 in_stack_fffffffffffff428;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffff430;
  undefined1 *puVar8;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  undefined1 *local_b48;
  undefined1 *local_b40;
  char *local_b38;
  char *local_b30;
  allocator<char> local_b21;
  char *local_b20;
  char *local_b18;
  undefined **local_b10;
  undefined1 local_b08;
  undefined1 *local_b00;
  char *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  undefined1 *local_a90;
  undefined1 *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  pair<const_char_*,_ArgsManager::Flags> local_6e0;
  undefined1 local_6d0 [32];
  undefined1 local_6b0 [32];
  undefined1 local_690 [32];
  undefined1 local_670 [32];
  undefined1 local_650 [40];
  undefined1 local_628 [32];
  undefined1 local_608 [32];
  undefined1 local_5e8 [32];
  undefined1 local_5c8 [32];
  undefined1 local_5a8 [32];
  undefined1 local_588 [32];
  undefined1 local_568 [32];
  undefined1 local_548 [32];
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _List local_508;
  undefined1 local_4f8 [32];
  undefined1 local_4d8 [32];
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  _List local_3d8;
  undefined1 local_3c8 [32];
  undefined1 local_3a8 [32];
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  path relative_path;
  path absolute_path;
  undefined1 local_2c8 [32];
  path root_path;
  ArgsManager local_args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_args);
  local_6e0.first = "-dir";
  local_6e0.second = ALLOW_ANY;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&root_path,&local_6e0);
  __l._M_len = 1;
  __l._M_array = (iterator)&root_path;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&absolute_path,__l,(allocator_type *)&relative_path.super_path);
  SetupArgs(&local_args,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&absolute_path);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&absolute_path);
  std::__cxx11::string::~string((string *)&root_path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&root_path,"",(allocator<char> *)&absolute_path);
  ResetArgs(&local_args,(string *)&root_path);
  std::__cxx11::string::~string((string *)&root_path);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x117;
  file.m_begin = (iterator)&local_6f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_700,msg);
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_708 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c8,"-dir",(allocator<char> *)local_528);
  absolute_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  absolute_path.super_path._M_pathname.field_2._8_8_ = 0;
  absolute_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  absolute_path.super_path._M_pathname._M_string_length = 0;
  absolute_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&absolute_path.super_path);
  arg._M_string_length = in_stack_fffffffffffff420;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&root_path,&local_args,arg,(path *)local_2c8);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  pvVar2 = (iterator)0x2;
  ppVar4 = &root_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_3f8,&local_710,0x117,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",
             &relative_path.super_path,"fs::path{}");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path(&root_path.super_path);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::__cxx11::string::~string((string *)local_2c8);
  fs::path::path(&root_path,"/");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&absolute_path,"-dir=/",(allocator<char> *)&relative_path);
  ResetArgs(&local_args,(string *)&absolute_path);
  std::__cxx11::string::~string((string *)&absolute_path);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)ppVar4;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x11b;
  file_00.m_begin = (iterator)&local_720;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_730,
             msg_00);
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_738 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"-dir",(allocator<char> *)local_528);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_00._M_string_length = in_stack_fffffffffffff420;
  arg_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_00.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_00.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&absolute_path,&local_args,arg_00,(path *)local_348);
  pvVar2 = (iterator)0x2;
  ppVar4 = &absolute_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_3f8,&local_740,0x11b,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&root_path,
             "root_path");
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&absolute_path,"-dir=/.",(allocator<char> *)&relative_path);
  ResetArgs(&local_args,(string *)&absolute_path);
  std::__cxx11::string::~string((string *)&absolute_path);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)ppVar4;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x11e;
  file_01.m_begin = (iterator)&local_750;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_760,
             msg_01);
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_768 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_368,"-dir",(allocator<char> *)local_528);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_01._M_string_length = in_stack_fffffffffffff420;
  arg_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_01.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_01.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&absolute_path,&local_args,arg_01,(path *)local_368);
  pvVar2 = (iterator)0x2;
  ppVar4 = &absolute_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_3f8,&local_770,0x11e,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&root_path,
             "root_path");
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::__cxx11::string::~string((string *)local_368);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&absolute_path,"-dir=/./",(allocator<char> *)&relative_path);
  ResetArgs(&local_args,(string *)&absolute_path);
  std::__cxx11::string::~string((string *)&absolute_path);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)ppVar4;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x121;
  file_02.m_begin = (iterator)&local_780;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_790,
             msg_02);
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_798 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"-dir",(allocator<char> *)local_528);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_02._M_string_length = in_stack_fffffffffffff420;
  arg_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_02.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_02.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&absolute_path,&local_args,arg_02,(path *)local_388);
  pvVar2 = (iterator)0x2;
  ppVar4 = &absolute_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_3f8,&local_7a0,0x121,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&root_path,
             "root_path");
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&absolute_path,"-dir=/.//",(allocator<char> *)&relative_path);
  ResetArgs(&local_args,(string *)&absolute_path);
  std::__cxx11::string::~string((string *)&absolute_path);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)ppVar4;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x124;
  file_03.m_begin = (iterator)&local_7b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_7c0,
             msg_03);
  local_3f8._8_8_ = local_3f8._8_8_ & 0xffffffffffffff00;
  local_3f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_3e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_3e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7c8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a8,"-dir",(allocator<char> *)local_528);
  relative_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  relative_path.super_path._M_pathname.field_2._8_8_ = 0;
  relative_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  relative_path.super_path._M_pathname._M_string_length = 0;
  relative_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&relative_path.super_path);
  arg_03._M_string_length = in_stack_fffffffffffff420;
  arg_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_03.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_03.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&absolute_path,&local_args,arg_03,(path *)local_3a8);
  pvVar2 = (iterator)0x2;
  ppVar4 = &absolute_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_3f8,&local_7d0,0x124,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&root_path,
             "root_path");
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::__cxx11::string::~string((string *)local_3a8);
  fs::path::path(&absolute_path,"/home/user/.bitcoin");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)ppVar4;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x13d;
  file_04.m_begin = (iterator)&local_7e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_7f0,
             msg_04);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_7f8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_04._M_string_length = in_stack_fffffffffffff420;
  arg_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_04.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_04.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_04,(path *)local_3c8);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_800,0x13d,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/root/../home/user/.bitcoin",
             (allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)ppVar4;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x140;
  file_05.m_begin = (iterator)&local_810;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_820,
             msg_05);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_828 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_418,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_05._M_string_length = in_stack_fffffffffffff420;
  arg_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_05.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_05.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_05,(path *)local_418);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_830,0x140,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/./user/.bitcoin",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)ppVar4;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x143;
  file_06.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_850,
             msg_06);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_858 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_06._M_string_length = in_stack_fffffffffffff420;
  arg_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_06.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_06.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_06,(path *)local_438);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_860,0x143,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)ppVar4;
  msg_07.m_begin = pvVar2;
  file_07.m_end = (iterator)0x146;
  file_07.m_begin = (iterator)&local_870;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_880,
             msg_07);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_888 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_458,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_07._M_string_length = in_stack_fffffffffffff420;
  arg_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_07.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_07.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_07,(path *)local_458);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_890,0x146,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin//",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)ppVar4;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0x149;
  file_08.m_begin = (iterator)&local_8a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_8b0,
             msg_08);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8b8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_478,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_08._M_string_length = in_stack_fffffffffffff420;
  arg_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_08.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_08.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_08,(path *)local_478);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_8c0,0x149,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/.",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)ppVar4;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0x14c;
  file_09.m_begin = (iterator)&local_8d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_8e0,
             msg_09);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8e8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_498,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_09._M_string_length = in_stack_fffffffffffff420;
  arg_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_09.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_09.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_09,(path *)local_498);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_8f0,0x14c,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/./",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)ppVar4;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0x14f;
  file_10.m_begin = (iterator)&local_900;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_910,
             msg_10);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_918 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b8,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_10._M_string_length = in_stack_fffffffffffff420;
  arg_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_10.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_10.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_10,(path *)local_4b8);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_920,0x14f,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relative_path,"-dir=/home/user/.bitcoin/.//",(allocator<char> *)local_3f8);
  ResetArgs(&local_args,(string *)&relative_path);
  std::__cxx11::string::~string((string *)&relative_path);
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)ppVar4;
  msg_11.m_begin = pvVar2;
  file_11.m_end = (iterator)0x152;
  file_11.m_begin = (iterator)&local_930;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_940,
             msg_11);
  local_528._8_8_ = local_528._8_8_ & 0xffffffffffffff00;
  local_528._0_8_ = &PTR__lazy_ostream_01139f30;
  local_518._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_518._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_950 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_948 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4d8,"-dir",(allocator<char> *)local_650);
  local_3e8._M_allocated_capacity = 0;
  local_3e8._8_8_ = 0;
  local_3f8._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_3f8._8_8_ = 0;
  local_3d8._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_3f8);
  arg_11._M_string_length = in_stack_fffffffffffff420;
  arg_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_11.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_11.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg(&relative_path,&local_args,arg_11,(path *)local_4d8);
  pvVar2 = (iterator)0x2;
  ppVar4 = &relative_path;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_528,&local_950,0x152,1,2,ppVar4,"local_args.GetPathArg(\"-dir\")",&absolute_path,
             "absolute_path");
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::__cxx11::string::~string((string *)local_4d8);
  fs::path::path(&relative_path,"user/.bitcoin");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)ppVar4;
  msg_12.m_begin = pvVar2;
  file_12.m_end = (iterator)0x156;
  file_12.m_begin = (iterator)&local_960;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_970,
             msg_12);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_978 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4f8,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_12._M_string_length = in_stack_fffffffffffff420;
  arg_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_12.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_12.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_12,(path *)local_4f8);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_980,0x156,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_4f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=somewhere/../user/.bitcoin",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_988 = "";
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_998 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar3;
  file_13.m_end = (iterator)0x159;
  file_13.m_begin = (iterator)&local_990;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_9a0,
             msg_13);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9a8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_548,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_13._M_string_length = in_stack_fffffffffffff420;
  arg_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_13.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_13.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_13,(path *)local_548);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_9b0,0x159,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/./.bitcoin",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9b8 = "";
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar2;
  msg_14.m_begin = pvVar3;
  file_14.m_end = (iterator)0x15c;
  file_14.m_begin = (iterator)&local_9c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_9d0,
             msg_14);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9d8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_568,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_14._M_string_length = in_stack_fffffffffffff420;
  arg_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_14.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_14.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_14,(path *)local_568);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_9e0,0x15c,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin/",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_9e8 = "";
  local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar2;
  msg_15.m_begin = pvVar3;
  file_15.m_end = (iterator)0x15f;
  file_15.m_begin = (iterator)&local_9f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_a00,
             msg_15);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a08 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_588,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_15._M_string_length = in_stack_fffffffffffff420;
  arg_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_15.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_15.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_15,(path *)local_588);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_a10,0x15f,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin//",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a18 = "";
  local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar2;
  msg_16.m_begin = pvVar3;
  file_16.m_end = (iterator)0x162;
  file_16.m_begin = (iterator)&local_a20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_a30,
             msg_16);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a38 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5a8,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_16._M_string_length = in_stack_fffffffffffff420;
  arg_16._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_16.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_16.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_16,(path *)local_5a8);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_a40,0x162,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin/.",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar2;
  msg_17.m_begin = pvVar3;
  file_17.m_end = (iterator)0x165;
  file_17.m_begin = (iterator)&local_a50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_a60,
             msg_17);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a68 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5c8,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_17._M_string_length = in_stack_fffffffffffff420;
  arg_17._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_17.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_17.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_17,(path *)local_5c8);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_a70,0x165,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_5c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin/./",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_a80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a78 = "";
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar2;
  msg_18.m_begin = pvVar3;
  file_18.m_end = (iterator)0x168;
  file_18.m_begin = (iterator)&local_a80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_a90,
             msg_18);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_a98 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5e8,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_18._M_string_length = in_stack_fffffffffffff420;
  arg_18._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_18.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_18.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_18,(path *)local_5e8);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_aa0,0x168,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=user/.bitcoin/.//",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_aa8 = "";
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar2;
  msg_19.m_begin = pvVar3;
  file_19.m_end = (iterator)0x16b;
  file_19.m_begin = (iterator)&local_ab0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ac0,
             msg_19);
  local_650[8] = 0;
  local_650._0_8_ = &PTR__lazy_ostream_01139f30;
  local_650._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_650._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ac8 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_608,"-dir",(allocator<char> *)&local_b10);
  local_518._M_allocated_capacity = 0;
  local_518._8_8_ = 0;
  local_528._0_8_ =
       (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
        )0x0;
  local_528._8_8_ = 0;
  local_508._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path((path *)local_528);
  arg_19._M_string_length = in_stack_fffffffffffff420;
  arg_19._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_19.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_19.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_19,(path *)local_608);
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_650,&local_ad0,0x16b,1,2,pvVar2,"local_args.GetPathArg(\"-dir\")",&relative_path,
             "relative_path");
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_608);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_ae0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_ad8 = "";
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar3;
  file_20.m_end = (iterator)0x175;
  file_20.m_begin = (iterator)&local_ae0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_af0,
             msg_20);
  local_b08 = 0;
  local_b10 = &PTR__lazy_ostream_01139f30;
  local_b00 = boost::unit_test::lazy_ostream::inst;
  local_af8 = "";
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b18 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_628,"-dir",&local_b21);
  fs::path::path((path *)local_528,"default");
  arg_20._M_string_length = in_stack_fffffffffffff420;
  arg_20._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_20.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_20.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_20,(path *)local_628);
  fs::path::path((path *)local_650,"default");
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&local_b10,&local_b20,0x175,1,2,pvVar2,"local_args.GetPathArg(\"-dir\", \"default\")",
             (path *)local_650,"fs::path{\"default\"}");
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_628);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=override",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_b38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b30 = "";
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = pvVar2;
  msg_21.m_begin = pvVar3;
  file_21.m_end = (iterator)0x177;
  file_21.m_begin = (iterator)&local_b38;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_b48,
             msg_21);
  local_b08 = 0;
  local_b10 = &PTR__lazy_ostream_01139f30;
  local_b00 = boost::unit_test::lazy_ostream::inst;
  local_af8 = "";
  local_b58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b50 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_670,"-dir",&local_b21);
  fs::path::path((path *)local_528,"default");
  arg_21._M_string_length = in_stack_fffffffffffff420;
  arg_21._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_21.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_21.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_21,(path *)local_670);
  fs::path::path((path *)local_650,"override");
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&local_b10,&local_b58,0x177,1,2,pvVar2,"local_args.GetPathArg(\"-dir\", \"default\")",
             (path *)local_650,"fs::path{\"override\"}");
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir=",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_b68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b60 = "";
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar2;
  msg_22.m_begin = pvVar3;
  file_22.m_end = (iterator)0x179;
  file_22.m_begin = (iterator)&local_b68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_b78,
             msg_22);
  local_b08 = 0;
  local_b10 = &PTR__lazy_ostream_01139f30;
  local_b00 = boost::unit_test::lazy_ostream::inst;
  local_af8 = "";
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b80 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_690,"-dir",&local_b21);
  fs::path::path((path *)local_528,"default");
  arg_22._M_string_length = in_stack_fffffffffffff420;
  arg_22._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_22.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_22.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_22,(path *)local_690);
  fs::path::path((path *)local_650,"default");
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&local_b10,&local_b88,0x179,1,2,pvVar2,"local_args.GetPathArg(\"-dir\", \"default\")",
             (path *)local_650,"fs::path{\"default\"}");
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_690);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-dir",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_b90 = "";
  local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar2;
  msg_23.m_begin = pvVar3;
  file_23.m_end = (iterator)0x17b;
  file_23.m_begin = (iterator)&local_b98;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_ba8,
             msg_23);
  local_b08 = 0;
  local_b10 = &PTR__lazy_ostream_01139f30;
  local_b00 = boost::unit_test::lazy_ostream::inst;
  local_af8 = "";
  local_bb8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_bb0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_6b0,"-dir",&local_b21);
  fs::path::path((path *)local_528,"default");
  arg_23._M_string_length = in_stack_fffffffffffff420;
  arg_23._M_dataplus._M_p = (pointer)in_stack_fffffffffffff418;
  arg_23.field_2._M_allocated_capacity = in_stack_fffffffffffff428;
  arg_23.field_2._8_8_ = in_stack_fffffffffffff430;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_23,(path *)local_6b0);
  fs::path::path((path *)local_650,"default");
  pvVar3 = (iterator)0x2;
  pvVar2 = local_3f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&local_b10,&local_bb8,0x17b,1,2,pvVar2,"local_args.GetPathArg(\"-dir\", \"default\")",
             (path *)local_650,"fs::path{\"default\"}");
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_6b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8,"-nodir",(allocator<char> *)local_528);
  ResetArgs(&local_args,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  local_bc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_bc0 = "";
  puVar7 = &boost::unit_test::basic_cstring<char_const>::null;
  puVar8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar2;
  msg_24.m_begin = pvVar3;
  file_24.m_end = (iterator)0x17d;
  file_24.m_begin = (iterator)&local_bc8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
             (size_t)&stack0xfffffffffffff428,msg_24);
  local_b08 = 0;
  local_b10 = &PTR__lazy_ostream_01139f30;
  local_b00 = boost::unit_test::lazy_ostream::inst;
  local_af8 = "";
  pcVar5 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  pcVar6 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_6d0,"-dir",&local_b21);
  fs::path::path((path *)local_528,"default");
  arg_24._M_string_length = (size_type)pcVar6;
  arg_24._M_dataplus._M_p = pcVar5;
  arg_24.field_2._M_allocated_capacity = (size_type)puVar7;
  arg_24.field_2._8_8_ = puVar8;
  ArgsManager::GetPathArg((path *)local_3f8,&local_args,arg_24,(path *)local_6d0);
  fs::path::path((path *)local_650,"");
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (&local_b10,&stack0xfffffffffffff418,0x17d,1,2,local_3f8,
             "local_args.GetPathArg(\"-dir\", \"default\")",(path *)local_650,"fs::path{\"\"}");
  std::filesystem::__cxx11::path::~path((path *)local_650);
  std::filesystem::__cxx11::path::~path((path *)local_3f8);
  std::filesystem::__cxx11::path::~path((path *)local_528);
  std::__cxx11::string::~string((string *)local_6d0);
  std::filesystem::__cxx11::path::~path(&relative_path.super_path);
  std::filesystem::__cxx11::path::~path(&absolute_path.super_path);
  std::filesystem::__cxx11::path::~path(&root_path.super_path);
  ArgsManager::~ArgsManager(&local_args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(patharg)
{
    ArgsManager local_args;

    const auto dir = std::make_pair("-dir", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {dir});
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), fs::path{});

    const fs::path root_path{"/"};
    ResetArgs(local_args, "-dir=/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

    ResetArgs(local_args, "-dir=/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), root_path);

#ifdef WIN32
    const fs::path win_root_path{"C:\\"};
    ResetArgs(local_args, "-dir=C:\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);

    ResetArgs(local_args, "-dir=C:\\.\\\\");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), win_root_path);
#endif

    const fs::path absolute_path{"/home/user/.bitcoin"};
    ResetArgs(local_args, "-dir=/home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/root/../home/user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/./user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    ResetArgs(local_args, "-dir=/home/user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), absolute_path);

    const fs::path relative_path{"user/.bitcoin"};
    ResetArgs(local_args, "-dir=user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=somewhere/../user/.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/./.bitcoin");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/./");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    ResetArgs(local_args, "-dir=user/.bitcoin/.//");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir"), relative_path);

    // Check negated and default argument handling. Specifying an empty argument
    // is the same as not specifying the argument. This is convenient for
    // scripting so later command line arguments can override earlier command
    // line arguments or bitcoin.conf values. Currently the -dir= case cannot be
    // distinguished from -dir case with no assignment, but #16545 would add the
    // ability to distinguish these in the future (and treat the no-assign case
    // like an imperative command or an error).
    ResetArgs(local_args, "");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir=override");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"override"});
    ResetArgs(local_args, "-dir=");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-dir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{"default"});
    ResetArgs(local_args, "-nodir");
    BOOST_CHECK_EQUAL(local_args.GetPathArg("-dir", "default"), fs::path{""});
}